

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqastparser.cpp
# Opt level: O3

Statement * __thiscall SQCompilation::SQParser::parseStatement(SQParser *this,bool closeframe)

{
  long lVar1;
  SQInteger SVar2;
  SQUnsignedInteger SVar3;
  long lVar4;
  BigChunk *pBVar5;
  bool global;
  uint uVar6;
  int iVar7;
  SwitchStatement *pSVar8;
  Arena *pAVar9;
  Chunk *pCVar10;
  int iVar11;
  int iVar12;
  int iVar13;
  
  uVar6 = this->_depth;
  if (500 < uVar6) {
    reportDiagnostic(this,0x1d);
    uVar6 = this->_depth;
  }
  this->_depth = uVar6 + 1;
  lVar1 = this->_token;
  iVar13 = (int)(this->_lex)._tokenline;
  iVar12 = (int)(this->_lex)._tokencolumn;
  if (0x132 < lVar1) {
    global = false;
    switch(lVar1) {
    case 0x143:
switchD_0015f7c7_caseD_143:
      pSVar8 = (SwitchStatement *)parseEnumStatement(this,global);
      break;
    case 0x144:
switchD_0015f7c7_caseD_144:
      pSVar8 = (SwitchStatement *)parseConstStatement(this,global);
      break;
    case 0x145:
    case 0x146:
    case 0x147:
    case 0x148:
    case 0x149:
    case 0x14a:
switchD_0015f72d_caseD_10d:
      pAVar9 = (Arena *)Expression(this,SQE_REGULAR);
      pCVar10 = Arena::findChunk(this->_astArena,0x28);
      pSVar8 = (SwitchStatement *)pCVar10->_ptr;
      pCVar10->_ptr = (uint8_t *)&pSVar8->_cases;
      (pSVar8->super_Statement).super_Node._op = TO_EXPR_STMT;
      (pSVar8->super_Statement).super_Node._coordinates.lineStart = -1;
      (pSVar8->super_Statement).super_Node._coordinates.columnStart = -1;
      (pSVar8->super_Statement).super_Node._coordinates.lineEnd = -1;
      (pSVar8->super_Statement).super_Node._coordinates.columnEnd = -1;
      (((Node *)&(pSVar8->super_Statement).super_Node.super_ArenaObj)->super_ArenaObj).
      _vptr_ArenaObj = (_func_int **)&PTR__ArenaObj_001a2b18;
      ((ArenaVector<SQCompilation::EnumConst> *)&pSVar8->_expr)->_arena = pAVar9;
      pBVar5 = pAVar9->_bigChunks;
      *(SQAllocContext *)&(pSVar8->super_Statement).super_Node._coordinates = pAVar9->_alloc_ctx;
      *(BigChunk **)&(pSVar8->super_Statement).super_Node._coordinates.lineEnd = pBVar5;
      goto LAB_0015fb1e;
    case 0x14b:
      Lex(this);
      global = true;
      if (this->_token == 0x143) goto switchD_0015f7c7_caseD_143;
      if (this->_token == 0x144) goto switchD_0015f7c7_caseD_144;
      pSVar8 = (SwitchStatement *)0x0;
      reportDiagnostic(this,0x17);
      break;
    case 0x14c:
      pSVar8 = (SwitchStatement *)parseDirectiveStatement(this);
      break;
    default:
      if (lVar1 != 0x133) {
        if (lVar1 == 0x150) goto switchD_0015f72d_caseD_11b;
        goto switchD_0015f72d_caseD_10d;
      }
      pSVar8 = (SwitchStatement *)parseLocalClassDeclStmt(this,false);
    }
    goto LAB_0015fb02;
  }
  switch(lVar1) {
  case 0x10c:
    pSVar8 = parseSwitchStatement(this);
    break;
  case 0x10d:
  case 0x10e:
  case 0x10f:
  case 0x111:
  case 0x116:
  case 0x118:
  case 0x119:
  case 0x11a:
  case 0x11c:
  case 0x11f:
  case 0x120:
  case 0x121:
  case 0x122:
  case 0x126:
    goto switchD_0015f72d_caseD_10d;
  case 0x110:
    pSVar8 = (SwitchStatement *)parseIfStatement(this);
    break;
  case 0x112:
    pSVar8 = (SwitchStatement *)parseWhileStatement(this);
    break;
  case 0x113:
    pCVar10 = Arena::findChunk(this->_astArena,0x28);
    pSVar8 = (SwitchStatement *)pCVar10->_ptr;
    pCVar10->_ptr = (uint8_t *)&pSVar8->_cases;
    (pSVar8->super_Statement).super_Node._op = TO_BREAK;
    (pSVar8->super_Statement).super_Node._coordinates.lineEnd = -1;
    (pSVar8->super_Statement).super_Node._coordinates.columnEnd = -1;
    (((Node *)&(pSVar8->super_Statement).super_Node.super_ArenaObj)->super_ArenaObj)._vptr_ArenaObj
         = (_func_int **)&PTR__ArenaObj_001a2a58;
    ((ArenaVector<SQCompilation::EnumConst> *)&pSVar8->_expr)->_arena = (Arena *)0x0;
    (pSVar8->super_Statement).super_Node._coordinates.lineStart = iVar13;
    (pSVar8->super_Statement).super_Node._coordinates.columnStart = iVar12;
    (pSVar8->super_Statement).super_Node._coordinates.lineEnd = (int)(this->_lex)._currentline;
    (pSVar8->super_Statement).super_Node._coordinates.columnEnd = (int)(this->_lex)._currentcolumn;
    Lex(this);
    goto LAB_0015fb1e;
  case 0x114:
    pSVar8 = (SwitchStatement *)parseForStatement(this);
    break;
  case 0x115:
    pSVar8 = (SwitchStatement *)parseDoWhileStatement(this);
    break;
  case 0x117:
    pSVar8 = (SwitchStatement *)parseForEachStatement(this);
    break;
  case 0x11b:
switchD_0015f72d_caseD_11b:
    pSVar8 = (SwitchStatement *)parseLocalDeclStatement(this);
    break;
  case 0x11d:
    pSVar8 = (SwitchStatement *)parseLocalFunctionDeclStmt(this,false);
    break;
  case 0x11e:
  case 0x124:
    SVar2 = (this->_lex)._currentline;
    iVar11 = (int)(this->_lex)._currentcolumn;
    Lex(this);
    if ((this->_lex)._prevtoken == 10) {
      pAVar9 = (Arena *)0x0;
    }
    else {
      lVar4 = this->_token;
      pAVar9 = (Arena *)0x0;
      if (lVar4 < 0x7d) {
        pAVar9 = (Arena *)0x0;
        if ((lVar4 != 0) && (lVar4 != 0x3b)) {
LAB_0015fb88:
          pAVar9 = (Arena *)Expression(this,SQE_RVALUE);
        }
      }
      else if ((lVar4 != 0x7d) && (lVar4 != 0x14c)) goto LAB_0015fb88;
    }
    if (lVar1 == 0x11e) {
      pCVar10 = Arena::findChunk(this->_astArena,0x30);
      pSVar8 = (SwitchStatement *)pCVar10->_ptr;
      pCVar10->_ptr = (uint8_t *)&(pSVar8->_cases)._vals;
      (pSVar8->super_Statement).super_Node._op = TO_RETURN;
      (pSVar8->super_Statement).super_Node._coordinates.lineStart = -1;
      (pSVar8->super_Statement).super_Node._coordinates.columnStart = -1;
      (pSVar8->super_Statement).super_Node._coordinates.lineEnd = -1;
      (pSVar8->super_Statement).super_Node._coordinates.columnEnd = -1;
      ((ArenaVector<SQCompilation::EnumConst> *)&pSVar8->_expr)->_arena = pAVar9;
      (((Node *)&(pSVar8->super_Statement).super_Node.super_ArenaObj)->super_ArenaObj).
      _vptr_ArenaObj = (_func_int **)&PTR__ArenaObj_001a2960;
      *(undefined1 *)&(pSVar8->_cases)._arena = 0;
    }
    else {
      pCVar10 = Arena::findChunk(this->_astArena,0x28);
      pSVar8 = (SwitchStatement *)pCVar10->_ptr;
      pCVar10->_ptr = (uint8_t *)&pSVar8->_cases;
      (pSVar8->super_Statement).super_Node._op = TO_YIELD;
      (pSVar8->super_Statement).super_Node._coordinates.lineStart = -1;
      (pSVar8->super_Statement).super_Node._coordinates.columnStart = -1;
      (pSVar8->super_Statement).super_Node._coordinates.lineEnd = -1;
      (pSVar8->super_Statement).super_Node._coordinates.columnEnd = -1;
      ((ArenaVector<SQCompilation::EnumConst> *)&pSVar8->_expr)->_arena = pAVar9;
      (((Node *)&(pSVar8->super_Statement).super_Node.super_ArenaObj)->super_ArenaObj).
      _vptr_ArenaObj = (_func_int **)&PTR__ArenaObj_001a29b0;
    }
    iVar7 = (int)SVar2;
    if (pAVar9 != (Arena *)0x0) {
      *(SQAllocContext *)&(pSVar8->super_Statement).super_Node._coordinates = pAVar9->_alloc_ctx;
      iVar7 = *(int *)&pAVar9->_bigChunks;
      iVar11 = *(int *)((long)&pAVar9->_bigChunks + 4);
    }
    (pSVar8->super_Statement).super_Node._coordinates.lineEnd = iVar7;
    (pSVar8->super_Statement).super_Node._coordinates.columnEnd = iVar11;
    goto LAB_0015faeb;
  case 0x123:
    pCVar10 = Arena::findChunk(this->_astArena,0x28);
    pSVar8 = (SwitchStatement *)pCVar10->_ptr;
    pCVar10->_ptr = (uint8_t *)&pSVar8->_cases;
    (pSVar8->super_Statement).super_Node._op = TO_CONTINUE;
    (pSVar8->super_Statement).super_Node._coordinates.lineEnd = -1;
    (pSVar8->super_Statement).super_Node._coordinates.columnEnd = -1;
    (((Node *)&(pSVar8->super_Statement).super_Node.super_ArenaObj)->super_ArenaObj)._vptr_ArenaObj
         = (_func_int **)&PTR__ArenaObj_001a2aa8;
    ((ArenaVector<SQCompilation::EnumConst> *)&pSVar8->_expr)->_arena = (Arena *)0x0;
    (pSVar8->super_Statement).super_Node._coordinates.lineStart = iVar13;
    (pSVar8->super_Statement).super_Node._coordinates.columnStart = iVar12;
    (pSVar8->super_Statement).super_Node._coordinates.lineEnd = (int)(this->_lex)._currentline;
    (pSVar8->super_Statement).super_Node._coordinates.columnEnd = (int)(this->_lex)._currentcolumn;
    Lex(this);
    goto LAB_0015fb1e;
  case 0x125:
    pSVar8 = (SwitchStatement *)parseTryCatchStatement(this);
    break;
  case 0x127:
    Lex(this);
    pAVar9 = (Arena *)Expression(this,SQE_RVALUE);
    pCVar10 = Arena::findChunk(this->_astArena,0x28);
    pSVar8 = (SwitchStatement *)pCVar10->_ptr;
    pCVar10->_ptr = (uint8_t *)&pSVar8->_cases;
    (pSVar8->super_Statement).super_Node._op = TO_THROW;
    (pSVar8->super_Statement).super_Node._coordinates.lineStart = -1;
    (pSVar8->super_Statement).super_Node._coordinates.columnStart = -1;
    (pSVar8->super_Statement).super_Node._coordinates.lineEnd = -1;
    (pSVar8->super_Statement).super_Node._coordinates.columnEnd = -1;
    ((ArenaVector<SQCompilation::EnumConst> *)&pSVar8->_expr)->_arena = pAVar9;
    (((Node *)&(pSVar8->super_Statement).super_Node.super_ArenaObj)->super_ArenaObj)._vptr_ArenaObj
         = (_func_int **)&PTR__ArenaObj_001a29e8;
    *(BigChunk **)&(pSVar8->super_Statement).super_Node._coordinates.lineEnd = pAVar9->_bigChunks;
LAB_0015faeb:
    (pSVar8->super_Statement).super_Node._coordinates.lineStart = iVar13;
    (pSVar8->super_Statement).super_Node._coordinates.columnStart = iVar12;
    goto LAB_0015fb1e;
  default:
    if (lVar1 == 0x3b) {
      pCVar10 = Arena::findChunk(this->_astArena,0x20);
      pSVar8 = (SwitchStatement *)pCVar10->_ptr;
      pCVar10->_ptr = (uint8_t *)&pSVar8->_expr;
      (pSVar8->super_Statement).super_Node._op = TO_EMPTY;
      (pSVar8->super_Statement).super_Node._coordinates.lineStart = -1;
      (pSVar8->super_Statement).super_Node._coordinates.columnStart = -1;
      (pSVar8->super_Statement).super_Node._coordinates.lineEnd = -1;
      (pSVar8->super_Statement).super_Node._coordinates.columnEnd = -1;
      (((Node *)&(pSVar8->super_Statement).super_Node.super_ArenaObj)->super_ArenaObj).
      _vptr_ArenaObj = (_func_int **)&PTR__ArenaObj_001a2ae0;
      Lex(this);
    }
    else {
      if (lVar1 != 0x7b) goto switchD_0015f72d_caseD_10d;
      SVar3 = this->_lang_features;
      Lex(this);
      pSVar8 = (SwitchStatement *)parseStatements(this);
      Expect(this,0x7d);
      this->_lang_features = SVar3;
    }
  }
LAB_0015fb02:
  (pSVar8->super_Statement).super_Node._coordinates.lineStart = iVar13;
  (pSVar8->super_Statement).super_Node._coordinates.columnStart = iVar12;
  (pSVar8->super_Statement).super_Node._coordinates.lineEnd = (int)(this->_lex)._currentline;
  (pSVar8->super_Statement).super_Node._coordinates.columnEnd = (int)(this->_lex)._currentcolumn;
LAB_0015fb1e:
  this->_depth = this->_depth - 1;
  return &pSVar8->super_Statement;
}

Assistant:

Statement* SQParser::parseStatement(bool closeframe)
{
    NestingChecker nc(this);
    Statement *result = NULL;
    SQInteger l = line(), c = column();

    switch(_token) {
    case _SC(';'):  result = newNode<EmptyStatement>(); Lex(); break;
    case TK_DIRECTIVE:  result = parseDirectiveStatement();    break;
    case TK_IF:     result = parseIfStatement();          break;
    case TK_WHILE:  result = parseWhileStatement();       break;
    case TK_DO:     result = parseDoWhileStatement();     break;
    case TK_FOR:    result = parseForStatement();         break;
    case TK_FOREACH:result = parseForEachStatement();     break;
    case TK_SWITCH: result = parseSwitchStatement();      break;
    case TK_LOCAL:
    case TK_LET:
        result = parseLocalDeclStatement();
        break;
    case TK_RETURN:
    case TK_YIELD: {
        SQOpcode op;
        if(_token == TK_RETURN) {
            op = _OP_RETURN;
        }
        else {
            op = _OP_YIELD;
        }
        SQInteger le = _lex._currentline;
        SQInteger ce = _lex._currentcolumn;
        Lex();

        Expr *arg = NULL;
        if(!IsEndOfStatement()) {
            arg = Expression(SQE_RVALUE);
        }

        result = op == _OP_RETURN ? static_cast<TerminateStatement *>(newNode<ReturnStatement>(arg)) : newNode<YieldStatement>(arg);
        if (arg) {
            copyCoordinates(arg, result);
        }
        else {
            result->setLineEndPos(le);
            result->setColumnEndPos(ce);
        }

        result->setLineStartPos(l);
        result->setColumnStartPos(c);

        return result;
    }
    case TK_BREAK:
        result = setCoordinates(newNode<BreakStatement>(nullptr), l, c);
        Lex();
        return result;
    case TK_CONTINUE:
        result = setCoordinates(newNode<ContinueStatement>(nullptr), l, c);
        Lex();
        return result;
    case TK_FUNCTION:
        result = parseLocalFunctionDeclStmt(false);
        break;
    case TK_CLASS:
        result = parseLocalClassDeclStmt(false);
        break;
    case TK_ENUM:
        result = parseEnumStatement(false);
        break;
    case _SC('{'):
    {
        SQUnsignedInteger savedLangFeatures = _lang_features;
        Lex();
        result = parseStatements();
        Expect(_SC('}'));
        _lang_features = savedLangFeatures;
        break;
    }
    case TK_TRY:
        result = parseTryCatchStatement();
        break;
    case TK_THROW: {
        Lex();
        Expr *e = Expression(SQE_RVALUE);
        result = copyCoordinates(e, newNode<ThrowStatement>(e));
        result->setLineStartPos(l); result->setColumnStartPos(c);
        return result;
    }
    case TK_CONST:
        result = parseConstStatement(false);
        break;
    case TK_GLOBAL:
        Lex();
        if (_token == TK_CONST)
            result = parseConstStatement(true);
        else if (_token == TK_ENUM)
            result = parseEnumStatement(true);
        else
            reportDiagnostic(DiagnosticsId::DI_GLOBAL_CONSTS_ONLY);
        break;
    default: {
        Expr *e = Expression(SQE_REGULAR);
        return copyCoordinates(e, newNode<ExprStatement>(e));
      }
    }

    setCoordinates(result, l, c);

    assert(result);
    return result;
}